

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O1

void __thiscall
asio::detail::
reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
::reactive_socket_accept_op
          (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,state_type state,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,tcp *protocol,
          endpoint *peer_endpoint,function<void_(const_std::error_code_&)> *handler,
          any_io_executor *io_ex)

{
  error_category *peVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.super_operation.func_ = do_complete;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.super_operation.task_result_ = 0;
  uVar3 = *(undefined4 *)&success_ec->field_0x4;
  peVar1 = success_ec->_M_cat;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.ec_._M_value = success_ec->_M_value;
  *(undefined4 *)
   &(this->
    super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
    ).super_reactor_op.ec_.field_0x4 = uVar3;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.ec_._M_cat = peVar1;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.cancellation_key_ = (void *)0x0;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.bytes_transferred_ = 0;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).super_reactor_op.perform_func_ =
       reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
       ::do_perform;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).socket_ = socket;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).state_ = state;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).new_socket_.socket_ = -1;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).peer_ = peer;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).protocol_.family_ = protocol->family_;
  sVar4 = 0x1c;
  if (peer_endpoint == (endpoint *)0x0) {
    sVar4 = 0;
  }
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).peer_endpoint_ = peer_endpoint;
  (this->
  super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ).addrlen_ = sVar4;
  *(undefined8 *)&(this->handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->handler_).super__Function_base._M_functor + 8) = 0;
  (this->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->handler_)._M_invoker = handler->_M_invoker;
  if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->handler_).super__Function_base._M_functor =
         *(undefined8 *)&(handler->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->handler_).super__Function_base._M_functor + 8) = uVar2;
    (this->handler_).super__Function_base._M_manager = (handler->super__Function_base)._M_manager;
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
  }
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
  handler_work_base(&(this->work_).
                     super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                    ,0,0,io_ex);
  return;
}

Assistant:

reactive_socket_accept_op(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state, Socket& peer,
      const Protocol& protocol, typename Protocol::endpoint* peer_endpoint,
      Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_accept_op_base<Socket, Protocol>(
        success_ec, socket, state, peer, protocol, peer_endpoint,
        &reactive_socket_accept_op::do_complete),
      handler_(static_cast<Handler&&>(handler)),
      work_(handler_, io_ex)
  {
  }